

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmeta.cpp
# Opt level: O2

void __thiscall CVmMetaTable::clear(CVmMetaTable *this)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = 0;
  for (uVar2 = 0; uVar2 < this->count_; uVar2 = uVar2 + 1) {
    vm_meta_entry_t::release_mem((vm_meta_entry_t *)((long)&this->table_->meta_ + lVar1));
    lVar1 = lVar1 + 0x38;
  }
  this->count_ = 0;
  return;
}

Assistant:

void CVmMetaTable::clear()
{
    size_t i;
    
    /* delete all of the property tables in the entries */
    for (i = 0 ; i < count_ ; ++i)
        table_[i].release_mem();
    
    /* 
     *   Reset the entry counter.  Note that this doesn't affect any
     *   allocation; we keep a separate count of the number of table slots
     *   we have allocated.  Table slots don't have any additional
     *   associated memory, so we don't need to worry about cleaning
     *   anything up at this point. 
     */
    count_ = 0;
}